

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

int32_t read_int32(lua_State *L,bson_reader *br)

{
  int32_t iVar1;
  
  check_reader(L,br,4);
  iVar1 = *(int32_t *)br->ptr;
  br->ptr = (uint8_t *)((long)br->ptr + 4);
  br->size = br->size + -4;
  return iVar1;
}

Assistant:

static inline int32_t
read_int32(lua_State *L, struct bson_reader *br) {
	check_reader(L, br, 4);
	const uint8_t * b = br->ptr;
	uint32_t v = b[0] | b[1]<<8 | b[2]<<16 | b[3]<<24;
	br->ptr+=4;
	br->size-=4;
	return (int32_t)v;
}